

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.h
# Opt level: O0

void __thiscall
booster::callback<void_()>::
callable_impl<void,_cppcms::http::(anonymous_namespace)::dispatch_binder>::~callable_impl
          (callable_impl<void,_cppcms::http::(anonymous_namespace)::dispatch_binder> *this)

{
  callable_impl<void,_cppcms::http::(anonymous_namespace)::dispatch_binder> *in_RDI;
  
  ~callable_impl(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

callable_impl(F f) : func(f){}